

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcTriangleFans.h
# Opt level: O0

O3DGCErrorCode __thiscall o3dgc::TriangleFans::AddTFAN(TriangleFans *this)

{
  long *__src;
  undefined1 auVar1 [16];
  ulong uVar2;
  long *plVar3;
  long local_30;
  long *tmp;
  TriangleFans *this_local;
  
  if (this->m_numTFANs < 0) {
    __assert_fail("m_numTFANs >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/../contrib/Open3DGC/o3dgcTriangleFans.h"
                  ,0xec,"O3DGCErrorCode o3dgc::TriangleFans::AddTFAN()");
  }
  this->m_numTFANs = this->m_numTFANs + 1;
  if (this->m_numTFANs == this->m_sizeTFANAllocatedSize) {
    this->m_sizeTFANAllocatedSize = this->m_sizeTFANAllocatedSize << 1;
    __src = this->m_sizeTFAN;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = this->m_sizeTFANAllocatedSize;
    uVar2 = SUB168(auVar1 * ZEXT816(8),0);
    if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
      uVar2 = 0xffffffffffffffff;
    }
    plVar3 = (long *)operator_new__(uVar2);
    this->m_sizeTFAN = plVar3;
    memcpy(this->m_sizeTFAN,__src,this->m_numTFANs << 3);
    if (__src != (long *)0x0) {
      operator_delete__(__src);
    }
  }
  if (this->m_numTFANs < 2) {
    local_30 = 0;
  }
  else {
    local_30 = this->m_sizeTFAN[this->m_numTFANs + -2];
  }
  this->m_sizeTFAN[this->m_numTFANs + -1] = local_30;
  return O3DGC_OK;
}

Assistant:

O3DGCErrorCode                AddTFAN()
                                    {
                                        assert(m_numTFANs >= 0);
                                        ++m_numTFANs;
                                        if (m_numTFANs == m_sizeTFANAllocatedSize)
                                        {
                                            m_sizeTFANAllocatedSize *= 2;
                                            long * tmp = m_sizeTFAN;
                                            m_sizeTFAN = new long [m_sizeTFANAllocatedSize];
                                            memcpy(m_sizeTFAN, tmp, sizeof(long) * m_numTFANs);
                                            delete [] tmp;
                                        }
                                        m_sizeTFAN[m_numTFANs-1] = (m_numTFANs > 1) ? m_sizeTFAN[m_numTFANs-2] : 0;
                                        return O3DGC_OK;
                                    }